

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O2

char * __thiscall util::fs::dirname(fs *this,char *__path)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  allocator *paVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  lVar3 = *(long *)(__path + 8);
  if (lVar3 == 0) {
    pcVar7 = ".";
    paVar6 = &local_13;
LAB_0010b689:
    std::__cxx11::string::string((string *)this,pcVar7,paVar6);
  }
  else {
    lVar8 = 0;
    lVar9 = *(long *)__path;
    do {
      lVar9 = lVar9 + -1;
      if (lVar3 == lVar8) {
        pcVar7 = "/";
        paVar6 = &local_12;
        goto LAB_0010b689;
      }
      lVar8 = lVar8 + 1;
    } while (*(char *)(lVar9 + lVar3) == '/');
    uVar4 = (lVar3 - lVar8) + 3;
    pcVar7 = (char *)((*(long *)__path + lVar3 + 1) - lVar8);
    do {
      if (uVar4 == 2) {
        pcVar7 = ".";
        paVar6 = &local_11;
        goto LAB_0010b689;
      }
      pcVar5 = pcVar7 + -1;
      uVar4 = uVar4 - 1;
      pcVar1 = pcVar7 + -1;
      pcVar7 = pcVar5;
    } while (*pcVar1 != '/');
    do {
      uVar4 = uVar4 - 1;
      if (uVar4 < 2) break;
      cVar2 = *pcVar5;
      pcVar5 = pcVar5 + -1;
    } while (cVar2 == '/');
    std::__cxx11::string::substr((ulong)this,(ulong)__path);
  }
  return (char *)this;
}

Assistant:

std::string
dirname (std::string const& path)
{
    if (path.empty())
        return ".";

    /* Skip group of slashes at the end. */
    std::size_t len = path.size();
    while (len > 0 && path[len - 1] == '/')
        len -= 1;
    if (len == 0)
        return "/";

    /* Skip basename. */
    while (len > 0 && path[len - 1] != '/')
        len -= 1;
    if (len == 0)
        return ".";

    /* Skip group of slashes. */
    while (len > 1 && path[len - 1] == '/')
        len -= 1;

    return path.substr(0, len);
}